

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# h264_slice.c
# Opt level: O0

int infer_intra(bitstream *str,h264_macroblock *mb,int which)

{
  int iVar1;
  undefined4 in_EDX;
  bitstream *in_RSI;
  int i;
  uint32_t in_stack_ffffffffffffffdc;
  int iVar2;
  
  for (iVar2 = 0; iVar2 < 4; iVar2 = iVar2 + 1) {
    iVar1 = vs_infer(in_RSI,(uint32_t *)CONCAT44(in_EDX,iVar2),in_stack_ffffffffffffffdc);
    if (iVar1 != 0) {
      return 1;
    }
  }
  iVar2 = 0;
  while( true ) {
    if (0xf < iVar2) {
      return 0;
    }
    iVar1 = vs_infers(in_RSI,(int32_t *)CONCAT44(in_EDX,iVar2),in_stack_ffffffffffffffdc);
    if (iVar1 != 0) break;
    iVar1 = vs_infers(in_RSI,(int32_t *)CONCAT44(in_EDX,iVar2),in_stack_ffffffffffffffdc);
    if (iVar1 != 0) {
      return 1;
    }
    iVar2 = iVar2 + 1;
  }
  return 1;
}

Assistant:

static int infer_intra(struct bitstream *str, struct h264_macroblock *mb, int which) {
	int i;
	for (i = 0; i < 4; i++) {
		if (vs_infer(str, &mb->ref_idx[which][i], 0)) return 1;
	}
	for (i = 0; i < 16; i++) {
		if (vs_infers(str, &mb->mvd[which][i][0], 0)) return 1;
		if (vs_infers(str, &mb->mvd[which][i][1], 0)) return 1;
	}
	return 0;
}